

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

type fmt::v5::
     visit_format_arg<ValueExtractor<long_long>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
               (ValueExtractor<long_long> *vis,
               basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               *arg)

{
  basic_string_view<char> bVar1;
  assertion_failure *this;
  
  if (arg->type_ == long_long_type) {
    return (arg->value_).field_0.long_long_value;
  }
  switch(arg->type_) {
  case named_arg_type:
    this = (assertion_failure *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this,"invalid argument type");
    __cxa_throw(this,&assertion_failure::typeinfo,std::logic_error::~logic_error);
  case int_type:
    ValueExtractor<long_long>::operator()(vis,(arg->value_).field_0.int_value);
  case uint_type:
    ValueExtractor<long_long>::operator()(vis,(arg->value_).field_0.uint_value);
  default:
    ValueExtractor<long_long>::operator()();
  case ulong_long_type:
    ValueExtractor<long_long>::operator()(vis,(arg->value_).field_0.ulong_long_value);
  case bool_type:
    ValueExtractor<long_long>::operator()(vis,(arg->value_).field_0.int_value != 0);
  case char_type:
    ValueExtractor<long_long>::operator()(vis,*(char *)&(arg->value_).field_0);
  case double_type:
    ValueExtractor<long_long>::operator()(vis,(arg->value_).field_0.double_value);
  case last_numeric_type:
    ValueExtractor<long_long>::operator()(vis,(arg->value_).field_0.long_double_value);
  case cstring_type:
    ValueExtractor<long_long>::operator()(vis,(arg->value_).field_0.string.value);
  case string_type:
    bVar1.data_ = *(char **)&(arg->value_).field_0;
    bVar1.size_ = *(size_t *)((long)&(arg->value_).field_0 + 8);
    ValueExtractor<long_long>::operator()(vis,bVar1);
  case pointer_type:
    ValueExtractor<long_long>::operator()(vis,(arg->value_).field_0.pointer);
  case custom_type:
    ValueExtractor<long_long>::operator()(vis,(handle)(arg->value_).field_0.string);
  }
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}